

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int bc_atom_to_idx(BCWriterState *s,uint32_t *pres,JSAtom atom)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = atom - s->first_atom;
  iVar2 = 0;
  if (-1 < (int)atom && s->first_atom <= atom) {
    lVar3 = (long)s->atom_to_idx_size;
    if (uVar4 < (uint)s->atom_to_idx_size) {
      atom = s->atom_to_idx[uVar4];
      if (atom != 0) goto LAB_00134718;
    }
    else {
      iVar2 = js_resize_array(s->ctx,&s->atom_to_idx,4,&s->atom_to_idx_size,uVar4 + 1);
      if (iVar2 != 0) {
        return -1;
      }
      for (; lVar3 < s->atom_to_idx_size; lVar3 = lVar3 + 1) {
        s->atom_to_idx[lVar3] = 0;
      }
    }
    iVar2 = js_resize_array(s->ctx,&s->idx_to_atom,4,&s->idx_to_atom_size,s->idx_to_atom_count + 1);
    if (iVar2 == 0) {
      uVar1 = s->idx_to_atom_count;
      s->idx_to_atom_count = uVar1 + 1;
      s->idx_to_atom[uVar1] = uVar4 + s->first_atom;
      atom = s->first_atom + uVar1;
      s->atom_to_idx[uVar4] = atom;
      iVar2 = 0;
    }
    else {
      iVar2 = -1;
      atom = 0;
    }
  }
LAB_00134718:
  *pres = atom;
  return iVar2;
}

Assistant:

static int bc_atom_to_idx(BCWriterState *s, uint32_t *pres, JSAtom atom)
{
    uint32_t v;

    if (atom < s->first_atom || __JS_AtomIsTaggedInt(atom)) {
        *pres = atom;
        return 0;
    }
    atom -= s->first_atom;
    if (atom < s->atom_to_idx_size && s->atom_to_idx[atom] != 0) {
        *pres = s->atom_to_idx[atom];
        return 0;
    }
    if (atom >= s->atom_to_idx_size) {
        int old_size, i;
        old_size = s->atom_to_idx_size;
        if (js_resize_array(s->ctx, (void **)&s->atom_to_idx,
                            sizeof(s->atom_to_idx[0]), &s->atom_to_idx_size,
                            atom + 1))
            return -1;
        /* XXX: could add a specific js_resize_array() function to do it */
        for(i = old_size; i < s->atom_to_idx_size; i++)
            s->atom_to_idx[i] = 0;
    }
    if (js_resize_array(s->ctx, (void **)&s->idx_to_atom,
                        sizeof(s->idx_to_atom[0]),
                        &s->idx_to_atom_size, s->idx_to_atom_count + 1))
        goto fail;

    v = s->idx_to_atom_count++;
    s->idx_to_atom[v] = atom + s->first_atom;
    v += s->first_atom;
    s->atom_to_idx[atom] = v;
    *pres = v;
    return 0;
 fail:
    *pres = 0;
    return -1;
}